

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

void boost::python::detail::error::
     virtual_function_default<PythonModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string)>
     ::must_be_derived_class_member<void(PythonModuleClient::*)(std::__cxx11::string)>
               (first_type *param_1)

{
  not_a_derived_class_member<void(PythonModuleClient::*)(std::__cxx11::string)>(0);
  return;
}

Assistant:

static void
        must_be_derived_class_member(Default const&)
        {
            // https://svn.boost.org/trac/boost/ticket/5803
            //typedef typename assertion<mpl::not_<detail::is_same<Default,Fn> > >::failed test0;
# if !BOOST_WORKAROUND(__MWERKS__, <= 0x2407)
            typedef typename assertion<detail::is_polymorphic<T> >::failed test1 BOOST_ATTRIBUTE_UNUSED;
# endif 
            typedef typename assertion<detail::is_member_function_pointer<Fn> >::failed test2 BOOST_ATTRIBUTE_UNUSED;
            not_a_derived_class_member<Default>(Fn());
        }